

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O1

void __thiscall
c4::yml::detail::stack<c4::yml::Parser::State,_16UL>::stack
          (stack<c4::yml::Parser::State,_16UL> *this,stack<c4::yml::Parser::State,_16UL> *that)

{
  pfn_allocate p_Var1;
  pfn_free p_Var2;
  pfn_error p_Var3;
  long lVar4;
  
  lVar4 = 8;
  do {
    *(undefined4 *)((long)this->m_buf + lVar4 + -8) = 0;
    memset((void *)((long)&this->m_buf[0].flags + lVar4),0,0x90);
    lVar4 = lVar4 + 0x98;
  } while (lVar4 != 0x988);
  this->m_stack = this->m_buf;
  this->m_size = 0;
  this->m_capacity = 0x10;
  p_Var1 = (that->m_callbacks).m_allocate;
  p_Var2 = (that->m_callbacks).m_free;
  p_Var3 = (that->m_callbacks).m_error;
  (this->m_callbacks).m_user_data = (that->m_callbacks).m_user_data;
  (this->m_callbacks).m_allocate = p_Var1;
  (this->m_callbacks).m_free = p_Var2;
  (this->m_callbacks).m_error = p_Var3;
  _mv(this,that);
  return;
}

Assistant:

stack(stack &&that) noexcept : stack(that.m_callbacks)
    {
        _mv(&that);
    }